

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdGetPrivkeyWif(void *handle,char *privkey,int network_type,bool is_compressed,char **wif)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  char *pcVar3;
  byte in_CL;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  string privkey_wif;
  Privkey key;
  NetType_conflict net_type;
  bool is_bitcoin;
  string *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe50;
  bool *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  string local_160;
  allocator local_139;
  string local_138;
  Privkey local_118;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  NetType local_b8;
  byte local_b3;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  byte local_1d;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_1d = in_CL & 1;
  local_28 = in_R8;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 1099;
    local_50.funcname = "CfdGetPrivkeyWif";
    cfd::core::logger::warn<>(&local_50,"wif is null.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. wif is null.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe50,error_code,in_stack_fffffffffffffe40);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    local_b3 = 1;
    local_b8 = cfd::capi::ConvertNetType(in_stack_fffffffffffffe94,in_stack_fffffffffffffe88);
    if ((local_b3 & 1) == 0) {
      local_d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                   ,0x2f);
      local_d0.filename = local_d0.filename + 1;
      local_d0.line = 0x45a;
      local_d0.funcname = "CfdGetPrivkeyWif";
      cfd::core::logger::warn<>(&local_d0,"privkey\'s network_type is invalid.");
      local_f2 = 1;
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f0,"Failed to parameter. privkey\'s network_type is invalid.",&local_f1);
      cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffe40);
      local_f2 = 0;
      __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    paVar4 = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,local_18,paVar4);
    cfd::core::Privkey::Privkey(&local_118,&local_138,kMainnet,true);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    cfd::core::Privkey::ConvertWif_abi_cxx11_(&local_160,&local_118,local_b8,(bool)(local_1d & 1));
    pcVar3 = cfd::capi::CreateString
                       ((string *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    *local_28 = pcVar3;
    local_4 = 0;
    std::__cxx11::string::~string((string *)&local_160);
    cfd::core::Privkey::~Privkey((Privkey *)0x606d5b);
    return local_4;
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x451;
  local_90.funcname = "CfdGetPrivkeyWif";
  cfd::core::logger::warn<>(&local_90,"privkey is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. privkey is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffe50,error_code,in_stack_fffffffffffffe40);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPrivkeyWif(
    void* handle, const char* privkey, int network_type, bool is_compressed,
    char** wif) {
  try {
    cfd::Initialize();
    if (wif == nullptr) {
      warn(CFD_LOG_SOURCE, "wif is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. wif is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    Privkey key(privkey);
    std::string privkey_wif = key.ConvertWif(net_type, is_compressed);
    *wif = CreateString(privkey_wif);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}